

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestAdsPerformance::Notifications(TestAdsPerformance *this,size_t numNotifications)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  int local_7c;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> notification;
  long local_70;
  string local_68;
  AdsNotificationAttrib attrib;
  
  lVar1 = AdsPortOpenEx();
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 != 0,&local_68,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x38f);
  std::__cxx11::string::~string((string *)&local_68);
  notification._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)
       operator_new__(-(ulong)(numNotifications >> 0x3e != 0) | numNotifications * 4);
  attrib.cbLength = 1;
  attrib.nTransMode = 3;
  attrib.nMaxDelay = 0;
  attrib.field_3 = (anon_union_4_2_382c730b_for_AdsNotificationAttrib_3)0xf4240;
  for (uVar2 = 0; uVar2 < numNotifications; uVar2 = uVar2 + 1) {
    local_7c = 0;
    local_70 = AdsSyncAddDeviceNotificationReqEx
                         (lVar1,(AmsAddr *)&server,0x4020,4,&attrib,NotifyCallback,uVar2,
                          (uint *)((ulong)uVar2 * 4 +
                                  (long)notification._M_t.
                                        super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                        .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl))
    ;
    fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
    fructose::test_root::test_assert_eq<int,long>
              ((test_root *)this,&local_7c,&local_70,&local_68,"0",
               "AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, &NotifyCallback, hUser, &notification[hUser])"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
               ,0x399);
    std::__cxx11::string::~string((string *)&local_68);
  }
  local_68._M_dataplus._M_p = (pointer)0x5;
  std::this_thread::sleep_for<long,std::ratio<1l,1l>>
            ((duration<long,_std::ratio<1L,_1L>_> *)&local_68);
  for (lVar3 = 0; (uint)lVar3 < (uint)numNotifications; lVar3 = lVar3 + 1) {
    local_7c = 0;
    local_70 = AdsSyncDelDeviceNotificationReqEx
                         (lVar1,(AmsAddr *)&server,
                          *(uint *)((long)notification._M_t.
                                          super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                          .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
                                   + lVar3 * 4));
    fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
    fructose::test_root::test_assert_eq<int,long>
              ((test_root *)this,&local_7c,&local_70,&local_68,"0",
               "AdsSyncDelDeviceNotificationReqEx(port, &server, notification[hUser])",
               "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
               ,0x39d);
    std::__cxx11::string::~string((string *)&local_68);
  }
  lVar1 = AdsPortCloseEx(lVar1);
  fructose::test_root::get_test_name_abi_cxx11_(&local_68,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,&local_68,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x39f);
  std::__cxx11::string::~string((string *)&local_68);
  std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr(&notification);
  return;
}

Assistant:

void Notifications(size_t numNotifications)
    {
        const long port = AdsPortOpenEx();
        fructose_assert(0 != port);

        const auto notification = std::unique_ptr<uint32_t[]>(new uint32_t[numNotifications]);
        AdsNotificationAttrib attrib = { 1, ADSTRANS_SERVERCYCLE, 0, {1000000} };
        uint32_t hUser = 0xDEADBEEF;

        for (hUser = 0; hUser < numNotifications; ++hUser) {
            fructose_assert_eq(0,
                               AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, &NotifyCallback,
                                                                 hUser,
                                                                 &notification[hUser]));
        }
        std::this_thread::sleep_for(std::chrono::seconds(5));
        for (hUser = 0; hUser < numNotifications; ++hUser) {
            fructose_assert_eq(0, AdsSyncDelDeviceNotificationReqEx(port, &server, notification[hUser]));
        }
        fructose_assert(0 == AdsPortCloseEx(port));
    }